

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

JObject * __thiscall
pstack::JObject::field<char[13],pstack::DumpCFAInsns,pstack::Dwarf::CFI_const*>
          (JObject *this,char (*k) [13],DumpCFAInsns *v,CFI **c)

{
  ostream *os;
  JSON<pstack::Field<char[13],_pstack::DumpCFAInsns>,_const_pstack::Dwarf::CFI_*> local_48;
  undefined1 local_38 [8];
  Field<char[13],_pstack::DumpCFAInsns> field;
  CFI **c_local;
  DumpCFAInsns *v_local;
  char (*k_local) [13];
  JObject *this_local;
  
  field.v = (DumpCFAInsns *)c;
  Field<char[13],_pstack::DumpCFAInsns>::Field
            ((Field<char[13],_pstack::DumpCFAInsns> *)local_38,k,v);
  os = std::operator<<(this->os,this->sep);
  local_48 = json<pstack::Field<char[13],pstack::DumpCFAInsns>,pstack::Dwarf::CFI_const*>
                       ((Field<char[13],_pstack::DumpCFAInsns> *)local_38,(CFI **)field.v);
  pstack::operator<<(os,&local_48);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }